

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Worker(Worker *this)

{
  Worker *this_local;
  
  this->close_pending_ = false;
  this->abort_ = false;
  this->done_ = false;
  this->pending_entries_in_queue_ = false;
  this->handle_ = (CURLM *)0x0;
  std::mutex::mutex(&this->mutex_);
  std::shared_ptr<restincurl::Worker::WorkerThread>::shared_ptr(&this->thread_);
  std::
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::deque(&this->queue_);
  std::
  map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
  ::map(&this->ongoing_);
  Signaler::Signaler(&this->signal_);
  return;
}

Assistant:

Worker() = default;